

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O3

void __thiscall QLocalSocketPrivate::_q_connectToSocket(QLocalSocketPrivate *this)

{
  QString *pQVar1;
  int iVar2;
  uint uVar3;
  QObject *this_00;
  QArrayData *pQVar4;
  undefined1 *puVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  int *piVar11;
  QSocketNotifier *this_01;
  QTimer *this_02;
  LocalSocketError error;
  undefined8 *puVar12;
  socklen_t __len;
  long in_FS_OFFSET;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QObject local_130 [8];
  QObject local_128 [8];
  QString local_120;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined1 *local_f8;
  QString local_e8;
  QArrayData *local_c8;
  char16_t *pcStack_c0;
  qsizetype qStack_b8;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_const_QString_&> local_a8;
  undefined2 uStack_80;
  undefined8 uStack_7e;
  undefined8 local_76;
  undefined8 uStack_6e;
  undefined8 local_66;
  undefined8 uStack_5e;
  undefined8 local_56;
  undefined4 uStack_4e;
  undefined4 uStack_4a;
  undefined4 uStack_46;
  undefined8 uStack_42;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QObject **)&this->field_0x8;
  if ((*(long **)&this->field_0x48 != (long *)0x0) && (**(long **)&this->field_0x48 != 0)) {
    QBindingStorage::registerDependency_helper((QUntypedPropertyData *)&this->field_0x40);
  }
  uVar3 = (this->socketOptions).super_QPropertyData<QFlags<QLocalSocket::SocketOption>_>.val.
          super_QFlagsStorageHelper<QLocalSocket::SocketOption,_4>.
          super_QFlagsStorage<QLocalSocket::SocketOption>.i;
  pQVar1 = &this->connectingName;
  local_e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  if ((uVar3 & 1) == 0) {
    cVar8 = QString::startsWith((QChar)(char16_t)pQVar1,0x2f);
    if (cVar8 != '\0') goto LAB_002436c1;
    QDir::tempPath();
    qVar7 = qStack_b8;
    pcVar6 = pcStack_c0;
    pQVar4 = local_c8;
    qStack_b8 = 0;
    local_c8 = (QArrayData *)0x0;
    pcStack_c0 = (char16_t *)0x0;
    local_a8.a.a.d.d._0_2_ = SUB82(pQVar4,0);
    local_a8.a.a.d.d._2_6_ = (undefined6)((ulong)pQVar4 >> 0x10);
    local_a8.a.a.d.ptr._0_2_ = SUB82(pcVar6,0);
    local_a8.a.a.d.ptr._2_6_ = (undefined6)((ulong)pcVar6 >> 0x10);
    local_a8.a.a.d.size._0_2_ = (undefined2)qVar7;
    local_a8.a.a.d.size._2_6_ = (undefined6)((ulong)qVar7 >> 0x10);
    local_a8.a.b = L'/';
    local_a8.b._2_6_ = (undefined6)((ulong)pQVar1 >> 0x10);
    local_a8.b._0_2_ = (char16_t)pQVar1;
    QStringBuilder<QStringBuilder<QString,_char16_t>,_const_QString_&>::convertTo<QString>
              (&local_e8,&local_a8);
    piVar11 = (int *)CONCAT62(local_a8.a.a.d.d._2_6_,local_a8.a.a.d.d._0_2_);
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT62(local_a8.a.a.d.d._2_6_,local_a8.a.a.d.d._0_2_),2,0x10);
      }
    }
    if (local_c8 != (QArrayData *)0x0) {
      LOCK();
      (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_c8,2,0x10);
      }
    }
  }
  else {
LAB_002436c1:
    local_e8.d.d = (this->connectingName).d.d;
    local_e8.d.ptr = (this->connectingName).d.ptr;
    local_e8.d.size = (this->connectingName).d.size;
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_e8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_e8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
  local_108 = 0xaaaaaaaa;
  uStack_104 = 0xaaaaaaaa;
  uStack_100 = 0xaaaaaaaa;
  uStack_fc = 0xaaaaaaaa;
  QString::toLocal8Bit_helper((QChar *)&local_108,(longlong)local_e8.d.ptr);
  puVar5 = local_f8;
  local_a8.a.a.d.d._0_2_ = 1;
  local_a8.a.a.d.d._2_6_ = 0;
  local_a8.a.a.d.ptr._0_2_ = 0;
  local_a8.a.a.d.ptr._2_6_ = 0;
  local_a8.a.a.d.size._0_2_ = 0;
  local_a8.a.a.d.size._2_6_ = 0;
  local_a8.a.b = L'\0';
  local_a8.a._26_6_ = 0;
  local_a8.b._0_2_ = 0;
  local_a8.b._2_6_ = 0;
  uStack_80 = 0;
  uStack_7e = 0;
  local_76 = 0;
  uStack_6e = 0;
  local_66 = 0;
  uStack_5e = 0;
  local_56 = 0;
  uStack_4e = 0;
  uStack_4a = 0;
  uStack_46 = 0;
  uStack_42 = 0;
  if (local_f8 + -0x6b < (undefined1 *)0xffffffffffffff93) {
    QVar13.m_data = (storage_type *)0x1d;
    QVar13.m_size = (qsizetype)&local_c8;
    QString::fromLatin1(QVar13);
    pQVar4 = local_c8;
    local_120.d.d = (Data *)local_c8;
    local_120.d.ptr = pcStack_c0;
    local_120.d.size = qStack_b8;
    setErrorAndEmit(this,ServerNotFoundError,&local_120);
    if (pQVar4 == (QArrayData *)0x0) goto LAB_00243bd1;
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    iVar2 = (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
  }
  else {
    if ((uVar3 & 1) == 0) {
      puVar12 = (undefined8 *)CONCAT44(uStack_fc,uStack_100);
      if (puVar12 == (undefined8 *)0x0) {
        puVar12 = &QByteArray::_empty;
      }
      __memcpy_chk((undefined1 *)((long)&local_a8.a.a.d.d + 2),puVar12,local_f8 + 1,0x6c);
      __len = 0x6e;
    }
    else {
      puVar12 = (undefined8 *)CONCAT44(uStack_fc,uStack_100);
      if (puVar12 == (undefined8 *)0x0) {
        puVar12 = &QByteArray::_empty;
      }
      __memcpy_chk((undefined1 *)((long)&local_a8.a.a.d.d + 3),puVar12,local_f8 + 1,0x6b);
      __len = (int)puVar5 + 3;
    }
    iVar2 = this->connectingSocket;
    do {
      iVar10 = connect(iVar2,(sockaddr *)&local_a8,__len);
      if (iVar10 != -1) {
        cancelDelayedConnect(this);
        QString::operator=(&this->serverName,(QString *)pQVar1);
        QString::operator=(&this->fullServerName,(QString *)&local_e8);
        bVar9 = QAbstractSocket::setSocketDescriptor
                          ((QAbstractSocket *)&this->unixSocket,(long)this->connectingSocket,
                           ConnectedState,
                           (OpenMode)
                           (this->connectingOpenMode).
                           super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                           super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
        if (bVar9) {
          QIODevice::open(this_00,(this->connectingOpenMode).
                                  super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                                  super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
          QLocalSocket::connected((QLocalSocket *)this_00);
        }
        else {
          QVar15.m_data = (storage_type *)0x1d;
          QVar15.m_size = (qsizetype)&local_c8;
          QString::fromLatin1(QVar15);
          pQVar4 = local_c8;
          local_120.d.d = (Data *)local_c8;
          local_120.d.ptr = pcStack_c0;
          local_120.d.size = qStack_b8;
          setErrorAndEmit(this,UnknownSocketError,&local_120);
          if (pQVar4 != (QArrayData *)0x0) {
            LOCK();
            (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_120.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        this->connectingSocket = -1;
        if ((this->connectingName).d.ptr != (char16_t *)0x0) {
          pQVar4 = &((pQVar1->d).d)->super_QArrayData;
          (pQVar1->d).d = (Data *)0x0;
          (this->connectingName).d.ptr = (char16_t *)0x0;
          (this->connectingName).d.size = 0;
          if (pQVar4 != (QArrayData *)0x0) {
            LOCK();
            (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar4,2,0x10);
            }
          }
        }
        (this->connectingOpenMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
        super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i = 0;
        goto LAB_00243bd1;
      }
      piVar11 = __errno_location();
    } while (*piVar11 == 4);
    QVar14.m_data = (storage_type *)0x1d;
    QVar14.m_size = (qsizetype)&local_c8;
    QString::fromLatin1(QVar14);
    pQVar4 = local_c8;
    local_120.d.d = (Data *)local_c8;
    local_120.d.ptr = pcStack_c0;
    local_120.d.size = qStack_b8;
    iVar2 = *piVar11;
    if (iVar2 < 0xd) {
      if (iVar2 == 1) {
LAB_00243b72:
        error = SocketAccessError;
        goto LAB_00243bac;
      }
      if (iVar2 == 2) {
        error = ServerNotFoundError;
        goto LAB_00243bac;
      }
      if (iVar2 != 0xb) goto LAB_00243b81;
      if (this->delayConnect == (QSocketNotifier *)0x0) {
        this_01 = (QSocketNotifier *)operator_new(0x10);
        QSocketNotifier::QSocketNotifier(this_01,(long)this->connectingSocket,Write,this_00);
        this->delayConnect = this_01;
        QObject::connect(local_128,(char *)this_01,(QObject *)"2activated(QSocketDescriptor)",
                         (char *)this_00,0x27d65e);
        QMetaObject::Connection::~Connection((Connection *)local_128);
      }
      if (this->connectTimer == (QTimer *)0x0) {
        this_02 = (QTimer *)operator_new(0x10);
        QTimer::QTimer(this_02,this_00);
        this->connectTimer = this_02;
        QObject::connect(local_130,(char *)this_02,(QObject *)"2timeout()",(char *)this_00,0x25fe9f)
        ;
        QMetaObject::Connection::~Connection((Connection *)local_130);
        QTimer::start((int)this->connectTimer);
      }
      QSocketNotifier::setEnabled(SUB81(this->delayConnect,0));
    }
    else {
      if (iVar2 < 0x6e) {
        if (iVar2 == 0xd) goto LAB_00243b72;
        if (iVar2 != 0x16) goto LAB_00243b81;
LAB_00243b66:
        error = ConnectionRefusedError;
      }
      else if (iVar2 == 0x6e) {
        error = SocketTimeoutError;
      }
      else {
        if (iVar2 == 0x6f) goto LAB_00243b66;
LAB_00243b81:
        error = UnknownSocketError;
      }
LAB_00243bac:
      setErrorAndEmit(this,error,&local_120);
    }
    if (pQVar4 == (QArrayData *)0x0) goto LAB_00243bd1;
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    iVar2 = (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
  }
  if (iVar2 == 0) {
    QArrayData::deallocate(&(local_120.d.d)->super_QArrayData,2,0x10);
  }
LAB_00243bd1:
  piVar11 = (int *)CONCAT44(uStack_104,local_108);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_104,local_108),1,0x10);
    }
  }
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLocalSocketPrivate::_q_connectToSocket()
{
    Q_Q(QLocalSocket);

    QLocalSocket::SocketOptions options = optionsForPlatform(socketOptions);
    const QString connectingPathName = pathNameForConnection(connectingName, options);
    const QByteArray encodedConnectingPathName = QFile::encodeName(connectingPathName);
    struct ::sockaddr_un addr;
    addr.sun_family = PF_UNIX;
    memset(addr.sun_path, 0, sizeof(addr.sun_path));

    // for abstract socket add 2 to length, to take into account trailing AND leading null
    constexpr unsigned int extraCharacters = PlatformSupportsAbstractNamespace ? 2 : 1;

    if (sizeof(addr.sun_path) < static_cast<size_t>(encodedConnectingPathName.size() + extraCharacters)) {
        QString function = "QLocalSocket::connectToServer"_L1;
        setErrorAndEmit(QLocalSocket::ServerNotFoundError, function);
        return;
    }

    QT_SOCKLEN_T addrSize = sizeof(::sockaddr_un);
    if (options.testFlag(QLocalSocket::AbstractNamespaceOption)) {
        ::memcpy(addr.sun_path + 1, encodedConnectingPathName.constData(),
                 encodedConnectingPathName.size() + 1);
        addrSize = offsetof(::sockaddr_un, sun_path) + encodedConnectingPathName.size() + 1;
    } else {
        ::memcpy(addr.sun_path, encodedConnectingPathName.constData(),
                 encodedConnectingPathName.size() + 1);
    }
    if (-1 == qt_safe_connect(connectingSocket, (struct sockaddr *)&addr, addrSize)) {
        QString function = "QLocalSocket::connectToServer"_L1;
        switch (errno)
        {
        case EINVAL:
        case ECONNREFUSED:
            setErrorAndEmit(QLocalSocket::ConnectionRefusedError, function);
            break;
        case ENOENT:
            setErrorAndEmit(QLocalSocket::ServerNotFoundError, function);
            break;
        case EACCES:
        case EPERM:
            setErrorAndEmit(QLocalSocket::SocketAccessError, function);
            break;
        case ETIMEDOUT:
            setErrorAndEmit(QLocalSocket::SocketTimeoutError, function);
            break;
        case EAGAIN:
            // Try again later, all of the sockets listening are full
            if (!delayConnect) {
                delayConnect = new QSocketNotifier(connectingSocket, QSocketNotifier::Write, q);
                q->connect(delayConnect, SIGNAL(activated(QSocketDescriptor)), q, SLOT(_q_connectToSocket()));
            }
            if (!connectTimer) {
                connectTimer = new QTimer(q);
                q->connect(connectTimer, SIGNAL(timeout()),
                                 q, SLOT(_q_abortConnectionAttempt()),
                                 Qt::DirectConnection);
                connectTimer->start(QT_CONNECT_TIMEOUT);
            }
            delayConnect->setEnabled(true);
            break;
        default:
            setErrorAndEmit(QLocalSocket::UnknownSocketError, function);
        }
        return;
    }

    // connected!
    cancelDelayedConnect();

    serverName = connectingName;
    fullServerName = connectingPathName;
    if (unixSocket.setSocketDescriptor(connectingSocket,
        QAbstractSocket::ConnectedState, connectingOpenMode)) {
        q->QIODevice::open(connectingOpenMode);
        q->emit connected();
    } else {
        QString function = "QLocalSocket::connectToServer"_L1;
        setErrorAndEmit(QLocalSocket::UnknownSocketError, function);
    }
    connectingSocket = -1;
    connectingName.clear();
    connectingOpenMode = { };
}